

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtException.h
# Opt level: O1

void __thiscall ft::Exception::~Exception(Exception *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_00191330;
  pcVar1 = (this->msg)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this);
  return;
}

Assistant:

Exception(const std::string& s, const FT_Error e)
    {
        msg = s + ", error code: " + std::to_string(e);
    }